

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void api_dynamic_suite::dynamic_last_unused_segment_const(void)

{
  boost::detail::
  test_all_eq_impl<std::ostream,int_const*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x255,"void api_dynamic_suite::dynamic_last_unused_segment_const()",(int *)0x0,
             (int *)0x0,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0);
  return;
}

Assistant:

void dynamic_last_unused_segment_const()
{
    std::array<int, 4> array = { 11, 22 };
    const circular_view<int> span(array.begin(), array.end(), array.begin(), 2);
    auto segment = span.last_unused_segment();
    {
        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
}